

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O0

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  value_type pLVar5;
  value_type pLVar6;
  pointer pMVar7;
  int *piVar8;
  long *plVar9;
  undefined8 uVar10;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_type sVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  FILE *pFVar23;
  bool bVar24;
  bool bVar25;
  size_type sVar26;
  reference ppLVar27;
  reference pvVar28;
  size_type sVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  pointer *ppiVar32;
  size_type sVar33;
  reference pvVar34;
  bool *pbVar35;
  long in_RDI;
  ConvolutionDepthWise *convolution2_7;
  ConvolutionDepthWise *convolution1_7;
  Convolution *convolution2_6;
  ConvolutionDepthWise *convolution1_6;
  ConvolutionDepthWise *convolution2_5;
  Convolution *convolution1_5;
  Convolution *convolution2_4;
  Convolution *convolution1_4;
  ConvolutionDepthWise *convolution_1;
  Convolution *convolution;
  size_t k;
  int split_top_blob_index;
  size_t p;
  bool all_conv;
  Split *split;
  size_t j_1;
  int top_blob_index_1;
  size_t i_1;
  ConvolutionDepthWise *convolution2_3;
  ConvolutionDepthWise *convolution1_3;
  Convolution *convolution2_2;
  ConvolutionDepthWise *convolution1_2;
  ConvolutionDepthWise *convolution2_1;
  Convolution *convolution1_1;
  Convolution *convolution2;
  Convolution *convolution1;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  size_type local_268;
  ulong local_258;
  size_type local_240;
  size_type local_230;
  size_type local_1e8;
  size_type local_1d8;
  
  sVar26 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                     (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  for (local_1d8 = 0; local_1d8 < sVar26; local_1d8 = local_1d8 + 1) {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_1d8)
    ;
    bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (bVar24) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                 local_1d8);
      bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      if (!bVar24) goto LAB_0017d67b;
    }
    else {
LAB_0017d67b:
      ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_1d8);
      pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar27)->tops,0);
      iVar1 = *pvVar28;
      local_1e8 = local_1d8;
LAB_0017d6c4:
      do {
        do {
          local_1e8 = local_1e8 + 1;
          if (sVar26 <= local_1e8) goto LAB_0017d7be;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_1e8);
          bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_1e8);
            bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar24) goto LAB_0017d6c4;
          }
          ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_1e8);
          sVar29 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar27)->bottoms);
        } while (sVar29 != 1);
        ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_1e8);
        pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar27)->bottoms,0);
      } while (*pvVar28 != iVar1);
LAB_0017d7be:
      pFVar23 = _stderr;
      if (local_1e8 != sVar26) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1d8);
        uVar30 = std::__cxx11::string::c_str();
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1e8);
        uVar31 = std::__cxx11::string::c_str();
        fprintf(pFVar23,"fuse_requantize %s %s\n",uVar30,uVar31);
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1d8);
        bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        if (bVar24) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_1e8);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1d8);
            pLVar5 = *ppLVar27;
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1e8);
            pLVar6 = *ppLVar27;
            if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
               (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_0017e523;
            *(int *)&pLVar5[1].type._M_string_length = (int)pLVar5[1].type._M_string_length + 100;
            ppiVar32 = &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            pbVar35 = &pLVar5[3].support_tensor_storage;
            if ((pointer *)pbVar35 != ppiVar32) {
              if (pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                pMVar7 = pLVar6[2].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start;
                LOCK();
                *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                UNLOCK();
              }
              lVar2._0_1_ = pLVar5[3].support_reserved_6;
              lVar2._1_1_ = pLVar5[3].support_reserved_7;
              lVar2._2_1_ = pLVar5[3].support_reserved_8;
              lVar2._3_1_ = pLVar5[3].support_reserved_9;
              lVar2._4_1_ = pLVar5[3].support_reserved_10;
              lVar2._5_1_ = pLVar5[3].support_reserved_11;
              lVar2._6_1_ = pLVar5[3].support_reserved_12;
              lVar2._7_1_ = pLVar5[3].support_reserved_13;
              if (lVar2 != 0) {
                piVar8 = *(int **)&pLVar5[3].support_reserved_6;
                LOCK();
                iVar1 = *piVar8;
                *piVar8 = *piVar8 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (*(long *)&pLVar5[3].type == 0) {
                    if (*(void **)pbVar35 != (void *)0x0) {
                      free(*(void **)pbVar35);
                    }
                  }
                  else {
                    uVar30._0_1_ = pLVar5[3].support_tensor_storage;
                    uVar30._1_1_ = pLVar5[3].support_reserved_00;
                    uVar30._2_1_ = pLVar5[3].support_reserved_0;
                    uVar30._3_1_ = pLVar5[3].support_reserved_1;
                    uVar30._4_1_ = pLVar5[3].support_reserved_2;
                    uVar30._5_1_ = pLVar5[3].support_reserved_3;
                    uVar30._6_1_ = pLVar5[3].support_reserved_4;
                    uVar30._7_1_ = pLVar5[3].support_reserved_5;
                    (**(code **)(**(long **)&pLVar5[3].type + 0x18))
                              (*(long **)&pLVar5[3].type,uVar30);
                  }
                }
              }
              pLVar5[3].support_tensor_storage = false;
              pLVar5[3].support_reserved_00 = false;
              pLVar5[3].support_reserved_0 = false;
              pLVar5[3].support_reserved_1 = false;
              pLVar5[3].support_reserved_2 = false;
              pLVar5[3].support_reserved_3 = false;
              pLVar5[3].support_reserved_4 = false;
              pLVar5[3].support_reserved_5 = false;
              pLVar5[3].userdata = (void *)0x0;
              pLVar5[3].typeindex = 0;
              *(undefined4 *)&pLVar5[3].type._M_string_length = 0;
              *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) = 0;
              *(undefined4 *)&pLVar5[3].type.field_2 = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
              *(undefined8 *)&pLVar5[3].name = 0;
              pLVar5[3].support_reserved_6 = false;
              pLVar5[3].support_reserved_7 = false;
              pLVar5[3].support_reserved_8 = false;
              pLVar5[3].support_reserved_9 = false;
              pLVar5[3].support_reserved_10 = false;
              pLVar5[3].support_reserved_11 = false;
              pLVar5[3].support_reserved_12 = false;
              pLVar5[3].support_reserved_13 = false;
              *(pointer *)pbVar35 = *ppiVar32;
              *(pointer *)&pLVar5[3].support_reserved_6 =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pLVar5[3].userdata =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              pLVar5[3].typeindex =
                   *(int *)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
              *(pointer *)&pLVar5[3].type =
                   pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)&pLVar5[3].type._M_string_length =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) =
                   *(undefined4 *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
              *(undefined4 *)&pLVar5[3].type.field_2 =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                   *(undefined4 *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3]._vptr_Layer;
              bVar24 = pLVar6[3].support_inplace;
              bVar25 = pLVar6[3].support_vulkan;
              bVar18 = pLVar6[3].support_packing;
              bVar19 = pLVar6[3].support_bf16_storage;
              bVar20 = pLVar6[3].support_fp16_storage;
              bVar21 = pLVar6[3].support_int8_storage;
              bVar22 = pLVar6[3].support_image_storage;
              pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].one_blob_only;
              pLVar5[3].name.field_0x1 = bVar24;
              pLVar5[3].name.field_0x2 = bVar25;
              pLVar5[3].name.field_0x3 = bVar18;
              pLVar5[3].name.field_0x4 = bVar19;
              pLVar5[3].name.field_0x5 = bVar20;
              pLVar5[3].name.field_0x6 = bVar21;
              pLVar5[3].name.field_0x7 = bVar22;
            }
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1d8);
        bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        if (bVar24) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_1e8);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1d8);
            pLVar5 = *ppLVar27;
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1e8);
            pLVar6 = *ppLVar27;
            if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
               (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1)) goto LAB_0017e523;
            *(int *)&pLVar5[1].type._M_string_length = (int)pLVar5[1].type._M_string_length + 100;
            pbVar35 = &pLVar5[3].support_tensor_storage;
            if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pbVar35 != &pLVar6[2].bottom_shapes
               ) {
              if (pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                pMVar7 = pLVar6[2].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                LOCK();
                *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                UNLOCK();
              }
              lVar3._0_1_ = pLVar5[3].support_reserved_6;
              lVar3._1_1_ = pLVar5[3].support_reserved_7;
              lVar3._2_1_ = pLVar5[3].support_reserved_8;
              lVar3._3_1_ = pLVar5[3].support_reserved_9;
              lVar3._4_1_ = pLVar5[3].support_reserved_10;
              lVar3._5_1_ = pLVar5[3].support_reserved_11;
              lVar3._6_1_ = pLVar5[3].support_reserved_12;
              lVar3._7_1_ = pLVar5[3].support_reserved_13;
              if (lVar3 != 0) {
                piVar8 = *(int **)&pLVar5[3].support_reserved_6;
                LOCK();
                iVar1 = *piVar8;
                *piVar8 = *piVar8 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (*(long *)&pLVar5[3].type == 0) {
                    if (*(void **)pbVar35 != (void *)0x0) {
                      free(*(void **)pbVar35);
                    }
                  }
                  else {
                    uVar31._0_1_ = pLVar5[3].support_tensor_storage;
                    uVar31._1_1_ = pLVar5[3].support_reserved_00;
                    uVar31._2_1_ = pLVar5[3].support_reserved_0;
                    uVar31._3_1_ = pLVar5[3].support_reserved_1;
                    uVar31._4_1_ = pLVar5[3].support_reserved_2;
                    uVar31._5_1_ = pLVar5[3].support_reserved_3;
                    uVar31._6_1_ = pLVar5[3].support_reserved_4;
                    uVar31._7_1_ = pLVar5[3].support_reserved_5;
                    (**(code **)(**(long **)&pLVar5[3].type + 0x18))
                              (*(long **)&pLVar5[3].type,uVar31);
                  }
                }
              }
              pLVar5[3].support_tensor_storage = false;
              pLVar5[3].support_reserved_00 = false;
              pLVar5[3].support_reserved_0 = false;
              pLVar5[3].support_reserved_1 = false;
              pLVar5[3].support_reserved_2 = false;
              pLVar5[3].support_reserved_3 = false;
              pLVar5[3].support_reserved_4 = false;
              pLVar5[3].support_reserved_5 = false;
              pLVar5[3].userdata = (void *)0x0;
              pLVar5[3].typeindex = 0;
              *(undefined4 *)&pLVar5[3].type._M_string_length = 0;
              *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) = 0;
              *(undefined4 *)&pLVar5[3].type.field_2 = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
              *(undefined8 *)&pLVar5[3].name = 0;
              pLVar5[3].support_reserved_6 = false;
              pLVar5[3].support_reserved_7 = false;
              pLVar5[3].support_reserved_8 = false;
              pLVar5[3].support_reserved_9 = false;
              pLVar5[3].support_reserved_10 = false;
              pLVar5[3].support_reserved_11 = false;
              pLVar5[3].support_reserved_12 = false;
              pLVar5[3].support_reserved_13 = false;
              *(pointer *)pbVar35 =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)&pLVar5[3].support_reserved_6 =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              pLVar5[3].userdata =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pLVar5[3].typeindex =
                   *(int *)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
              *(pointer *)&pLVar5[3].type =
                   pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              *(undefined4 *)&pLVar5[3].type._M_string_length =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) =
                   *(undefined4 *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)&pLVar5[3].type.field_2 = *(undefined4 *)&pLVar6[3]._vptr_Layer;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                   *(undefined4 *)((long)&pLVar6[3]._vptr_Layer + 4);
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3].one_blob_only;
              bVar24 = pLVar6[3].support_reserved_00;
              bVar25 = pLVar6[3].support_reserved_0;
              bVar18 = pLVar6[3].support_reserved_1;
              bVar19 = pLVar6[3].support_reserved_2;
              bVar20 = pLVar6[3].support_reserved_3;
              bVar21 = pLVar6[3].support_reserved_4;
              bVar22 = pLVar6[3].support_reserved_5;
              pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].support_tensor_storage;
              pLVar5[3].name.field_0x1 = bVar24;
              pLVar5[3].name.field_0x2 = bVar25;
              pLVar5[3].name.field_0x3 = bVar18;
              pLVar5[3].name.field_0x4 = bVar19;
              pLVar5[3].name.field_0x5 = bVar20;
              pLVar5[3].name.field_0x6 = bVar21;
              pLVar5[3].name.field_0x7 = bVar22;
            }
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1d8);
        bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        if (bVar24) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_1e8);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1d8);
            pLVar5 = *ppLVar27;
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1e8);
            pLVar6 = *ppLVar27;
            if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1) ||
               (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_0017e523;
            *(int *)((long)&pLVar5[1].type._M_string_length + 4) =
                 *(int *)((long)&pLVar5[1].type._M_string_length + 4) + 100;
            ppiVar32 = &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            pbVar35 = &pLVar5[3].support_reserved_6;
            if ((pointer *)pbVar35 != ppiVar32) {
              if (pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                pMVar7 = pLVar6[2].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start;
                LOCK();
                *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                UNLOCK();
              }
              if (pLVar5[3].userdata != (void *)0x0) {
                piVar8 = (int *)pLVar5[3].userdata;
                LOCK();
                iVar1 = *piVar8;
                *piVar8 = *piVar8 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (pLVar5[3].type._M_string_length == 0) {
                    if (*(void **)pbVar35 != (void *)0x0) {
                      free(*(void **)pbVar35);
                    }
                  }
                  else {
                    plVar9 = (long *)pLVar5[3].type._M_string_length;
                    uVar4._0_1_ = pLVar5[3].support_reserved_6;
                    uVar4._1_1_ = pLVar5[3].support_reserved_7;
                    uVar4._2_1_ = pLVar5[3].support_reserved_8;
                    uVar4._3_1_ = pLVar5[3].support_reserved_9;
                    uVar4._4_1_ = pLVar5[3].support_reserved_10;
                    uVar4._5_1_ = pLVar5[3].support_reserved_11;
                    uVar4._6_1_ = pLVar5[3].support_reserved_12;
                    uVar4._7_1_ = pLVar5[3].support_reserved_13;
                    (**(code **)(*plVar9 + 0x18))(plVar9,uVar4);
                  }
                }
              }
              pLVar5[3].support_reserved_6 = false;
              pLVar5[3].support_reserved_7 = false;
              pLVar5[3].support_reserved_8 = false;
              pLVar5[3].support_reserved_9 = false;
              pLVar5[3].support_reserved_10 = false;
              pLVar5[3].support_reserved_11 = false;
              pLVar5[3].support_reserved_12 = false;
              pLVar5[3].support_reserved_13 = false;
              *(undefined8 *)&pLVar5[3].typeindex = 0;
              *(undefined4 *)&pLVar5[3].type = 0;
              *(undefined4 *)&pLVar5[3].type.field_2 = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) = 0;
              *(undefined4 *)&pLVar5[3].name = 0;
              pLVar5[3].name._M_string_length = 0;
              pLVar5[3].userdata = (void *)0x0;
              *(pointer *)pbVar35 = *ppiVar32;
              pLVar5[3].userdata =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)&pLVar5[3].typeindex =
                   pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              *(undefined4 *)&pLVar5[3].type =
                   *(undefined4 *)
                    &pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
              pLVar5[3].type._M_string_length =
                   (size_type)
                   pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)&pLVar5[3].type.field_2 =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                   *(undefined4 *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) =
                   *(undefined4 *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)&pLVar5[3].name = *(undefined4 *)&pLVar6[3]._vptr_Layer;
              pLVar5[3].name._M_string_length = *(size_type *)&pLVar6[3].one_blob_only;
            }
          }
        }
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   local_1d8);
        bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        if (bVar24) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_1e8);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1d8);
            pLVar5 = *ppLVar27;
            ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_1e8);
            pLVar6 = *ppLVar27;
            if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_finish == (pointer)0x1) &&
               (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish == (pointer)0x1)) {
              *(int *)((long)&pLVar5[1].type._M_string_length + 4) =
                   *(int *)((long)&pLVar5[1].type._M_string_length + 4) + 100;
              pbVar35 = &pLVar5[3].support_reserved_6;
              if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pbVar35 !=
                  &pLVar6[2].bottom_shapes) {
                if (pLVar6[2].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  pMVar7 = pLVar6[2].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  LOCK();
                  *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                  UNLOCK();
                }
                if (pLVar5[3].userdata != (void *)0x0) {
                  piVar8 = (int *)pLVar5[3].userdata;
                  LOCK();
                  iVar1 = *piVar8;
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (iVar1 == 1) {
                    if (pLVar5[3].type._M_string_length == 0) {
                      if (*(void **)pbVar35 != (void *)0x0) {
                        free(*(void **)pbVar35);
                      }
                    }
                    else {
                      plVar9 = (long *)pLVar5[3].type._M_string_length;
                      uVar10._0_1_ = pLVar5[3].support_reserved_6;
                      uVar10._1_1_ = pLVar5[3].support_reserved_7;
                      uVar10._2_1_ = pLVar5[3].support_reserved_8;
                      uVar10._3_1_ = pLVar5[3].support_reserved_9;
                      uVar10._4_1_ = pLVar5[3].support_reserved_10;
                      uVar10._5_1_ = pLVar5[3].support_reserved_11;
                      uVar10._6_1_ = pLVar5[3].support_reserved_12;
                      uVar10._7_1_ = pLVar5[3].support_reserved_13;
                      (**(code **)(*plVar9 + 0x18))(plVar9,uVar10);
                    }
                  }
                }
                pLVar5[3].support_reserved_6 = false;
                pLVar5[3].support_reserved_7 = false;
                pLVar5[3].support_reserved_8 = false;
                pLVar5[3].support_reserved_9 = false;
                pLVar5[3].support_reserved_10 = false;
                pLVar5[3].support_reserved_11 = false;
                pLVar5[3].support_reserved_12 = false;
                pLVar5[3].support_reserved_13 = false;
                *(undefined8 *)&pLVar5[3].typeindex = 0;
                *(undefined4 *)&pLVar5[3].type = 0;
                *(undefined4 *)&pLVar5[3].type.field_2 = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) = 0;
                *(undefined4 *)&pLVar5[3].name = 0;
                pLVar5[3].name._M_string_length = 0;
                pLVar5[3].userdata = (void *)0x0;
                *(pointer *)pbVar35 =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pLVar5[3].userdata =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                *(pointer *)&pLVar5[3].typeindex =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                *(undefined4 *)&pLVar5[3].type =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
                pLVar5[3].type._M_string_length =
                     (size_type)
                     pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                *(undefined4 *)&pLVar5[3].type.field_2 =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                     *(undefined4 *)&pLVar6[3]._vptr_Layer;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) =
                     *(undefined4 *)((long)&pLVar6[3]._vptr_Layer + 4);
                bVar24 = pLVar6[3].support_inplace;
                bVar25 = pLVar6[3].support_vulkan;
                bVar18 = pLVar6[3].support_packing;
                pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].one_blob_only;
                pLVar5[3].name.field_0x1 = bVar24;
                pLVar5[3].name.field_0x2 = bVar25;
                pLVar5[3].name.field_0x3 = bVar18;
                pLVar5[3].name._M_string_length = *(size_type *)&pLVar6[3].support_tensor_storage;
              }
            }
          }
        }
      }
    }
LAB_0017e523:
  }
  local_230 = 0;
  do {
    if (sVar26 <= local_230) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_230)
    ;
    bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (bVar24) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                 local_230);
      bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      if (!bVar24) goto LAB_0017e5c7;
    }
    else {
LAB_0017e5c7:
      ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_230);
      pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar27)->tops,0);
      iVar1 = *pvVar28;
      sVar29 = local_230;
      do {
        do {
          do {
            sVar17 = sVar29;
            local_240 = sVar17 + 1;
            if (sVar26 <= local_240) goto LAB_0017e6d8;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_240);
            bVar24 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            sVar29 = local_240;
          } while (bVar24);
          ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_240);
          sVar33 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar27)->bottoms);
          sVar29 = local_240;
        } while (sVar33 != 1);
        ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_240);
        pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar27)->bottoms,0);
        sVar29 = local_240;
      } while (*pvVar28 != iVar1);
LAB_0017e6d8:
      if (local_240 != sVar26) {
        ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_240);
        pLVar5 = *ppLVar27;
        bVar24 = true;
        for (local_258 = 0; sVar29 = std::vector<int,_std::allocator<int>_>::size(&pLVar5->tops),
            local_258 < sVar29; local_258 = local_258 + 1) {
          pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->tops,local_258);
          iVar1 = *pvVar28;
          for (local_268 = sVar17 + 2; local_268 < sVar26; local_268 = local_268 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_268);
            bVar25 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar25) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_268);
              bVar25 = std::operator!=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
              if (!bVar25) goto LAB_0017e80e;
            }
            else {
LAB_0017e80e:
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_268);
              sVar29 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar27)->bottoms);
              if (sVar29 == 1) {
                ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                     (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                       (in_RDI + 0x58),local_268);
                pvVar28 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&(*ppLVar27)->bottoms,0);
                if (*pvVar28 == iVar1) break;
              }
            }
          }
          if (local_268 == sVar26) {
            bVar24 = false;
            break;
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_268);
          bVar25 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if ((bVar25) &&
             (ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_268),
             (*ppLVar27)[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) {
            bVar24 = false;
            break;
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_268);
          bVar25 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if ((bVar25) &&
             (ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_268),
             (*ppLVar27)[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
             _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1)) {
            bVar24 = false;
            break;
          }
        }
        if (bVar24) {
          this_00 = *(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50);
          pvVar28 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->tops,0);
          pvVar34 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (this_00,(long)*pvVar28);
          pFVar23 = _stderr;
          sVar29 = (size_type)pvVar34->consumer;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_230);
          uVar30 = std::__cxx11::string::c_str();
          uVar31 = std::__cxx11::string::c_str();
          fprintf(pFVar23,"fuse_requantize %s %s\n",uVar30,uVar31);
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_230);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar29);
            bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar24) {
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_230);
              pLVar5 = *ppLVar27;
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),sVar29);
              pLVar6 = *ppLVar27;
              if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
                 (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_0017f6e0;
              *(int *)&pLVar5[1].type._M_string_length = (int)pLVar5[1].type._M_string_length + 100;
              ppiVar32 = &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              pbVar35 = &pLVar5[3].support_tensor_storage;
              if ((pointer *)pbVar35 != ppiVar32) {
                if (pLVar6[2].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  pMVar7 = pLVar6[2].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  LOCK();
                  *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                  UNLOCK();
                }
                lVar11._0_1_ = pLVar5[3].support_reserved_6;
                lVar11._1_1_ = pLVar5[3].support_reserved_7;
                lVar11._2_1_ = pLVar5[3].support_reserved_8;
                lVar11._3_1_ = pLVar5[3].support_reserved_9;
                lVar11._4_1_ = pLVar5[3].support_reserved_10;
                lVar11._5_1_ = pLVar5[3].support_reserved_11;
                lVar11._6_1_ = pLVar5[3].support_reserved_12;
                lVar11._7_1_ = pLVar5[3].support_reserved_13;
                if (lVar11 != 0) {
                  piVar8 = *(int **)&pLVar5[3].support_reserved_6;
                  LOCK();
                  iVar1 = *piVar8;
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (iVar1 == 1) {
                    if (*(long *)&pLVar5[3].type == 0) {
                      if (*(void **)pbVar35 != (void *)0x0) {
                        free(*(void **)pbVar35);
                      }
                    }
                    else {
                      uVar12._0_1_ = pLVar5[3].support_tensor_storage;
                      uVar12._1_1_ = pLVar5[3].support_reserved_00;
                      uVar12._2_1_ = pLVar5[3].support_reserved_0;
                      uVar12._3_1_ = pLVar5[3].support_reserved_1;
                      uVar12._4_1_ = pLVar5[3].support_reserved_2;
                      uVar12._5_1_ = pLVar5[3].support_reserved_3;
                      uVar12._6_1_ = pLVar5[3].support_reserved_4;
                      uVar12._7_1_ = pLVar5[3].support_reserved_5;
                      (**(code **)(**(long **)&pLVar5[3].type + 0x18))
                                (*(long **)&pLVar5[3].type,uVar12);
                    }
                  }
                }
                pLVar5[3].support_tensor_storage = false;
                pLVar5[3].support_reserved_00 = false;
                pLVar5[3].support_reserved_0 = false;
                pLVar5[3].support_reserved_1 = false;
                pLVar5[3].support_reserved_2 = false;
                pLVar5[3].support_reserved_3 = false;
                pLVar5[3].support_reserved_4 = false;
                pLVar5[3].support_reserved_5 = false;
                pLVar5[3].userdata = (void *)0x0;
                pLVar5[3].typeindex = 0;
                *(undefined4 *)&pLVar5[3].type._M_string_length = 0;
                *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) = 0;
                *(undefined4 *)&pLVar5[3].type.field_2 = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
                *(undefined8 *)&pLVar5[3].name = 0;
                pLVar5[3].support_reserved_6 = false;
                pLVar5[3].support_reserved_7 = false;
                pLVar5[3].support_reserved_8 = false;
                pLVar5[3].support_reserved_9 = false;
                pLVar5[3].support_reserved_10 = false;
                pLVar5[3].support_reserved_11 = false;
                pLVar5[3].support_reserved_12 = false;
                pLVar5[3].support_reserved_13 = false;
                *(pointer *)pbVar35 = *ppiVar32;
                *(pointer *)&pLVar5[3].support_reserved_6 =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pLVar5[3].userdata =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pLVar5[3].typeindex =
                     *(int *)&pLVar6[2].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                *(pointer *)&pLVar5[3].type =
                     pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                *(undefined4 *)&pLVar5[3].type._M_string_length =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
                *(undefined4 *)&pLVar5[3].type.field_2 =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                     *(undefined4 *)&pLVar6[3]._vptr_Layer;
                bVar24 = pLVar6[3].support_inplace;
                bVar25 = pLVar6[3].support_vulkan;
                bVar18 = pLVar6[3].support_packing;
                bVar19 = pLVar6[3].support_bf16_storage;
                bVar20 = pLVar6[3].support_fp16_storage;
                bVar21 = pLVar6[3].support_int8_storage;
                bVar22 = pLVar6[3].support_image_storage;
                pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].one_blob_only;
                pLVar5[3].name.field_0x1 = bVar24;
                pLVar5[3].name.field_0x2 = bVar25;
                pLVar5[3].name.field_0x3 = bVar18;
                pLVar5[3].name.field_0x4 = bVar19;
                pLVar5[3].name.field_0x5 = bVar20;
                pLVar5[3].name.field_0x6 = bVar21;
                pLVar5[3].name.field_0x7 = bVar22;
              }
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_230);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar29);
            bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar24) {
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_230);
              pLVar5 = *ppLVar27;
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),sVar29);
              pLVar6 = *ppLVar27;
              if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x1) ||
                 (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x1)) goto LAB_0017f6e0;
              *(int *)&pLVar5[1].type._M_string_length = (int)pLVar5[1].type._M_string_length + 100;
              pbVar35 = &pLVar5[3].support_tensor_storage;
              if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pbVar35 !=
                  &pLVar6[2].bottom_shapes) {
                if (pLVar6[2].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  pMVar7 = pLVar6[2].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  LOCK();
                  *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                  UNLOCK();
                }
                lVar13._0_1_ = pLVar5[3].support_reserved_6;
                lVar13._1_1_ = pLVar5[3].support_reserved_7;
                lVar13._2_1_ = pLVar5[3].support_reserved_8;
                lVar13._3_1_ = pLVar5[3].support_reserved_9;
                lVar13._4_1_ = pLVar5[3].support_reserved_10;
                lVar13._5_1_ = pLVar5[3].support_reserved_11;
                lVar13._6_1_ = pLVar5[3].support_reserved_12;
                lVar13._7_1_ = pLVar5[3].support_reserved_13;
                if (lVar13 != 0) {
                  piVar8 = *(int **)&pLVar5[3].support_reserved_6;
                  LOCK();
                  iVar1 = *piVar8;
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (iVar1 == 1) {
                    if (*(long *)&pLVar5[3].type == 0) {
                      if (*(void **)pbVar35 != (void *)0x0) {
                        free(*(void **)pbVar35);
                      }
                    }
                    else {
                      uVar14._0_1_ = pLVar5[3].support_tensor_storage;
                      uVar14._1_1_ = pLVar5[3].support_reserved_00;
                      uVar14._2_1_ = pLVar5[3].support_reserved_0;
                      uVar14._3_1_ = pLVar5[3].support_reserved_1;
                      uVar14._4_1_ = pLVar5[3].support_reserved_2;
                      uVar14._5_1_ = pLVar5[3].support_reserved_3;
                      uVar14._6_1_ = pLVar5[3].support_reserved_4;
                      uVar14._7_1_ = pLVar5[3].support_reserved_5;
                      (**(code **)(**(long **)&pLVar5[3].type + 0x18))
                                (*(long **)&pLVar5[3].type,uVar14);
                    }
                  }
                }
                pLVar5[3].support_tensor_storage = false;
                pLVar5[3].support_reserved_00 = false;
                pLVar5[3].support_reserved_0 = false;
                pLVar5[3].support_reserved_1 = false;
                pLVar5[3].support_reserved_2 = false;
                pLVar5[3].support_reserved_3 = false;
                pLVar5[3].support_reserved_4 = false;
                pLVar5[3].support_reserved_5 = false;
                pLVar5[3].userdata = (void *)0x0;
                pLVar5[3].typeindex = 0;
                *(undefined4 *)&pLVar5[3].type._M_string_length = 0;
                *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) = 0;
                *(undefined4 *)&pLVar5[3].type.field_2 = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
                *(undefined8 *)&pLVar5[3].name = 0;
                pLVar5[3].support_reserved_6 = false;
                pLVar5[3].support_reserved_7 = false;
                pLVar5[3].support_reserved_8 = false;
                pLVar5[3].support_reserved_9 = false;
                pLVar5[3].support_reserved_10 = false;
                pLVar5[3].support_reserved_11 = false;
                pLVar5[3].support_reserved_12 = false;
                pLVar5[3].support_reserved_13 = false;
                *(pointer *)pbVar35 =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)&pLVar5[3].support_reserved_6 =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pLVar5[3].userdata =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                pLVar5[3].typeindex =
                     *(int *)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start;
                *(pointer *)&pLVar5[3].type =
                     pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                *(undefined4 *)&pLVar5[3].type._M_string_length =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                *(undefined4 *)((long)&pLVar5[3].type._M_string_length + 4) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
                *(undefined4 *)&pLVar5[3].type.field_2 = *(undefined4 *)&pLVar6[3]._vptr_Layer;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                     *(undefined4 *)((long)&pLVar6[3]._vptr_Layer + 4);
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                     *(undefined4 *)&pLVar6[3].one_blob_only;
                bVar24 = pLVar6[3].support_reserved_00;
                bVar25 = pLVar6[3].support_reserved_0;
                bVar18 = pLVar6[3].support_reserved_1;
                bVar19 = pLVar6[3].support_reserved_2;
                bVar20 = pLVar6[3].support_reserved_3;
                bVar21 = pLVar6[3].support_reserved_4;
                bVar22 = pLVar6[3].support_reserved_5;
                pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].support_tensor_storage;
                pLVar5[3].name.field_0x1 = bVar24;
                pLVar5[3].name.field_0x2 = bVar25;
                pLVar5[3].name.field_0x3 = bVar18;
                pLVar5[3].name.field_0x4 = bVar19;
                pLVar5[3].name.field_0x5 = bVar20;
                pLVar5[3].name.field_0x6 = bVar21;
                pLVar5[3].name.field_0x7 = bVar22;
              }
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_230);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar29);
            bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar24) {
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_230);
              pLVar5 = *ppLVar27;
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),sVar29);
              pLVar6 = *ppLVar27;
              if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x1) ||
                 (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x1)) goto LAB_0017f6e0;
              *(int *)((long)&pLVar5[1].type._M_string_length + 4) =
                   *(int *)((long)&pLVar5[1].type._M_string_length + 4) + 100;
              ppiVar32 = &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              pbVar35 = &pLVar5[3].support_reserved_6;
              if ((pointer *)pbVar35 != ppiVar32) {
                if (pLVar6[2].bottom_shapes.
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  pMVar7 = pLVar6[2].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  LOCK();
                  *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                  UNLOCK();
                }
                if (pLVar5[3].userdata != (void *)0x0) {
                  piVar8 = (int *)pLVar5[3].userdata;
                  LOCK();
                  iVar1 = *piVar8;
                  *piVar8 = *piVar8 + -1;
                  UNLOCK();
                  if (iVar1 == 1) {
                    if (pLVar5[3].type._M_string_length == 0) {
                      if (*(void **)pbVar35 != (void *)0x0) {
                        free(*(void **)pbVar35);
                      }
                    }
                    else {
                      plVar9 = (long *)pLVar5[3].type._M_string_length;
                      uVar15._0_1_ = pLVar5[3].support_reserved_6;
                      uVar15._1_1_ = pLVar5[3].support_reserved_7;
                      uVar15._2_1_ = pLVar5[3].support_reserved_8;
                      uVar15._3_1_ = pLVar5[3].support_reserved_9;
                      uVar15._4_1_ = pLVar5[3].support_reserved_10;
                      uVar15._5_1_ = pLVar5[3].support_reserved_11;
                      uVar15._6_1_ = pLVar5[3].support_reserved_12;
                      uVar15._7_1_ = pLVar5[3].support_reserved_13;
                      (**(code **)(*plVar9 + 0x18))(plVar9,uVar15);
                    }
                  }
                }
                pLVar5[3].support_reserved_6 = false;
                pLVar5[3].support_reserved_7 = false;
                pLVar5[3].support_reserved_8 = false;
                pLVar5[3].support_reserved_9 = false;
                pLVar5[3].support_reserved_10 = false;
                pLVar5[3].support_reserved_11 = false;
                pLVar5[3].support_reserved_12 = false;
                pLVar5[3].support_reserved_13 = false;
                *(undefined8 *)&pLVar5[3].typeindex = 0;
                *(undefined4 *)&pLVar5[3].type = 0;
                *(undefined4 *)&pLVar5[3].type.field_2 = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) = 0;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) = 0;
                *(undefined4 *)&pLVar5[3].name = 0;
                pLVar5[3].name._M_string_length = 0;
                pLVar5[3].userdata = (void *)0x0;
                *(pointer *)pbVar35 = *ppiVar32;
                pLVar5[3].userdata =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)&pLVar5[3].typeindex =
                     pLVar6[2].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                *(undefined4 *)&pLVar5[3].type =
                     *(undefined4 *)
                      &pLVar6[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                pLVar5[3].type._M_string_length =
                     (size_type)
                     pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                *(undefined4 *)&pLVar5[3].type.field_2 =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                     *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) =
                     *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
                *(undefined4 *)&pLVar5[3].name = *(undefined4 *)&pLVar6[3]._vptr_Layer;
                pLVar5[3].name._M_string_length = *(size_type *)&pLVar6[3].one_blob_only;
              }
            }
          }
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_230);
          bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          if (bVar24) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       sVar29);
            bVar24 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            if (bVar24) {
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_230);
              pLVar5 = *ppLVar27;
              ppLVar27 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),sVar29);
              pLVar6 = *ppLVar27;
              if ((pLVar5[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x1) &&
                 (pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish == (pointer)0x1)) {
                *(int *)((long)&pLVar5[1].type._M_string_length + 4) =
                     *(int *)((long)&pLVar5[1].type._M_string_length + 4) + 100;
                pbVar35 = &pLVar5[3].support_reserved_6;
                if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pbVar35 !=
                    &pLVar6[2].bottom_shapes) {
                  if (pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish != (pointer)0x0) {
                    pMVar7 = pLVar6[2].bottom_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    LOCK();
                    *(int *)&pMVar7->data = *(int *)&pMVar7->data + 1;
                    UNLOCK();
                  }
                  in_stack_fffffffffffffc90 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar35;
                  if (pLVar5[3].userdata != (void *)0x0) {
                    piVar8 = (int *)pLVar5[3].userdata;
                    LOCK();
                    iVar1 = *piVar8;
                    *piVar8 = *piVar8 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (pLVar5[3].type._M_string_length == 0) {
                        if (*(void **)pbVar35 != (void *)0x0) {
                          free(*(void **)pbVar35);
                        }
                      }
                      else {
                        plVar9 = (long *)pLVar5[3].type._M_string_length;
                        uVar16._0_1_ = pLVar5[3].support_reserved_6;
                        uVar16._1_1_ = pLVar5[3].support_reserved_7;
                        uVar16._2_1_ = pLVar5[3].support_reserved_8;
                        uVar16._3_1_ = pLVar5[3].support_reserved_9;
                        uVar16._4_1_ = pLVar5[3].support_reserved_10;
                        uVar16._5_1_ = pLVar5[3].support_reserved_11;
                        uVar16._6_1_ = pLVar5[3].support_reserved_12;
                        uVar16._7_1_ = pLVar5[3].support_reserved_13;
                        (**(code **)(*plVar9 + 0x18))(plVar9,uVar16);
                      }
                    }
                  }
                  *(undefined8 *)in_stack_fffffffffffffc90 = 0;
                  (in_stack_fffffffffffffc90->field_2)._M_allocated_capacity = 0;
                  *(undefined4 *)((long)&in_stack_fffffffffffffc90->field_2 + 8) = 0;
                  *(undefined4 *)&in_stack_fffffffffffffc90[1]._M_string_length = 0;
                  *(undefined4 *)((long)&in_stack_fffffffffffffc90[1]._M_string_length + 4) = 0;
                  *(undefined4 *)&in_stack_fffffffffffffc90[1].field_2 = 0;
                  *(undefined4 *)((long)&in_stack_fffffffffffffc90[1].field_2 + 4) = 0;
                  *(undefined4 *)((long)&in_stack_fffffffffffffc90[1].field_2 + 8) = 0;
                  *(size_type *)(in_stack_fffffffffffffc90 + 2) = 0;
                  in_stack_fffffffffffffc90->_M_string_length = 0;
                  *(pointer *)pbVar35 =
                       pLVar6[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  pLVar5[3].userdata =
                       pLVar6[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  *(pointer *)&pLVar5[3].typeindex =
                       pLVar6[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  *(undefined4 *)&pLVar5[3].type =
                       *(undefined4 *)
                        &pLVar6[2].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start;
                  pLVar5[3].type._M_string_length =
                       (size_type)
                       pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  *(undefined4 *)&pLVar5[3].type.field_2 =
                       *(undefined4 *)
                        &pLVar6[2].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                  *(undefined4 *)((long)&pLVar5[3].type.field_2 + 4) =
                       *(undefined4 *)
                        ((long)&pLVar6[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4);
                  *(undefined4 *)((long)&pLVar5[3].type.field_2 + 8) =
                       *(undefined4 *)&pLVar6[3]._vptr_Layer;
                  *(undefined4 *)((long)&pLVar5[3].type.field_2 + 0xc) =
                       *(undefined4 *)((long)&pLVar6[3]._vptr_Layer + 4);
                  bVar24 = pLVar6[3].support_inplace;
                  bVar25 = pLVar6[3].support_vulkan;
                  bVar18 = pLVar6[3].support_packing;
                  pLVar5[3].name._M_dataplus = (_Alloc_hider)pLVar6[3].one_blob_only;
                  pLVar5[3].name.field_0x1 = bVar24;
                  pLVar5[3].name.field_0x2 = bVar25;
                  pLVar5[3].name.field_0x3 = bVar18;
                  pLVar5[3].name._M_string_length = *(size_type *)&pLVar6[3].support_tensor_storage;
                }
              }
            }
          }
        }
      }
    }
LAB_0017f6e0:
    local_230 = local_230 + 1;
  } while( true );
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}